

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O3

void cmCMakePresetsErrors::CYCLIC_PRESET_INHERITANCE(string *presetName,cmJSONState *state)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  size_type local_40;
  pointer local_38;
  undefined8 local_30;
  undefined8 local_28;
  char *local_20;
  undefined8 local_18;
  
  local_58.first._M_len = 0x26;
  local_58.first._M_str = "Cyclic preset inheritance for preset \"";
  local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38 = (presetName->_M_dataplus)._M_p;
  local_40 = presetName->_M_string_length;
  local_30 = 0;
  local_28 = 1;
  local_20 = "\"";
  local_18 = 0;
  views._M_len = 3;
  views._M_array = &local_58;
  cmCatViews(&local_78,views);
  cmJSONState::AddError(state,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CYCLIC_PRESET_INHERITANCE(const std::string& presetName,
                               cmJSONState* state)

{
  state->AddError(
    cmStrCat("Cyclic preset inheritance for preset \"", presetName, "\""));
}